

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::VarSourceVisitor::visit(VarSourceVisitor *this,Var *var)

{
  Var *var_00;
  int iVar1;
  iterator iVar2;
  undefined4 extraout_var;
  mapped_type *set;
  long *plVar3;
  Var *local_30;
  Var *var_local;
  
  local_30 = var;
  iVar2 = std::
          _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->map_)._M_h,&local_30);
  if (iVar2.
      super__Node_iterator_base<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = (*(local_30->super_IRNode)._vptr_IRNode[0x10])();
    plVar3 = (long *)(CONCAT44(extraout_var,iVar1) + 0x10);
    while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
      var_00 = *(Var **)(plVar3[1] + 200);
      set = std::__detail::
            _Map_base<kratos::Var_*,_std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<kratos::Var_*,_std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->map_,&local_30);
      get_source_var(var_00,set);
    }
  }
  return;
}

Assistant:

void visit(Var *var) override {
        if (map_.find(var) != map_.end()) return;
        auto const &sources = var->sources();
        for (auto const &stmt : sources) {
            auto *right = stmt->right();
            get_source_var(right, map_[var]);
        }
    }